

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O2

void __thiscall
rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
::rmq(rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
      *this,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            begin,
     __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
     end,unsigned_long superblock_size,unsigned_long block_size)

{
  ushort uVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  pointer puVar5;
  pointer pvVar6;
  pointer pvVar7;
  uint __line;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  long lVar9;
  long lVar10;
  unsigned_long uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *prVar17;
  ulong uVar18;
  ulong uVar19;
  char *__assertion;
  ushort uVar20;
  size_type __n;
  unsigned_long uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong *puVar24;
  difference_type __d;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var25;
  long lVar26;
  allocator_type local_d1;
  ulong *local_d0;
  ulong *local_c8;
  ulong local_c0;
  vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
  *local_b8;
  rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *local_b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  unsigned_long local_40;
  long local_38;
  
  (this->_begin)._M_current = begin._M_current;
  (this->_end)._M_current = end._M_current;
  this->superblock_size = superblock_size;
  this->block_size = block_size;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = begin._M_current;
  if ((long)end._M_current - (long)begin._M_current == -8) {
    __assertion = "(index_t)std::distance(begin, end) < std::numeric_limits<index_t>::max()";
    __line = 0x50;
  }
  else {
    uVar11 = (long)end._M_current - (long)begin._M_current >> 3;
    this->n = uVar11;
    if (superblock_size % block_size == 0) {
      uVar12 = uVar11 - 1;
      __n = uVar12 / superblock_size + 1;
      this->n_superblocks = __n;
      this->n_blocks = uVar12 / block_size + 1;
      this->n_blocks_per_superblock = superblock_size / block_size;
      if (0xfffffffffffeffff < superblock_size - 0x10001) {
        local_b8 = (vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                    *)&this->block_mins;
        local_b0 = this;
        local_90 = (vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    *)&this->superblock_mins;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,__n,&local_d1)
        ;
        std::
        vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
        ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    *)&this->superblock_mins,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a8);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a8,
                   local_b0->n_blocks,(allocator_type *)&local_d1);
        std::
        vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
        ::emplace_back<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                  (local_b8,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a8);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                  ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a8);
        puVar16 = local_c8;
        local_80 = superblock_size;
        do {
          puVar24 = local_c8;
          if (puVar16 == end._M_current) {
            uVar12 = local_b0->n_superblocks;
            local_d0 = (ulong *)0x2;
            prVar17 = local_b0;
            lVar10 = 1;
            do {
              uVar13 = (ulong)local_d0 >> 1;
              if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
                uVar11 = prVar17->n_blocks;
                local_c0 = prVar17->n_blocks_per_superblock;
                local_70 = uVar11 - (uVar12 - 1) * local_c0;
                local_78 = 1;
                uVar13 = 2;
                while( true ) {
                  uVar14 = uVar13;
                  local_88 = uVar14 >> 1;
                  uVar13 = uVar11;
                  if (local_c0 < uVar11) {
                    uVar13 = local_c0;
                  }
                  if ((uVar13 <= local_88) || (uVar11 == uVar12 * uVar14 >> 1)) break;
                  lVar10 = local_70 - local_88;
                  if (local_70 < local_88) {
                    lVar10 = 0;
                  }
                  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a8,
                             (local_c0 - local_88) * (uVar12 - 1) + lVar10,
                             (allocator_type *)&local_d1);
                  std::
                  vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                  ::emplace_back<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                            (local_b8,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                      &local_a8);
                  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)
                             &local_a8);
                  uVar11 = prVar17->n_blocks;
                  uVar12 = prVar17->n_superblocks;
                  local_c0 = prVar17->n_blocks_per_superblock;
                  uVar13 = uVar14 >> 2;
                  local_48 = local_c0 - uVar13;
                  local_50 = ~uVar13;
                  local_60 = local_c0 * 2 + local_88 * -2;
                  local_58 = local_c0 * 2 + uVar13 * -2;
                  uVar13 = 0;
                  lVar10 = 0;
                  for (uVar18 = 0; lVar9 = lVar10, uVar22 = uVar13, uVar18 != uVar12;
                      uVar18 = uVar18 + 1) {
                    uVar13 = uVar11 - local_c0 * uVar18;
                    if (local_c0 < uVar13) {
                      uVar13 = local_c0;
                    }
                    pvVar6 = (prVar17->block_mins).
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pvVar7 = (prVar17->block_mins).
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    uVar23 = uVar22;
                    lVar10 = lVar9;
                    for (uVar15 = local_88; uVar15 < uVar13; uVar15 = uVar15 + 1) {
                      uVar19 = uVar15;
                      if (uVar13 + local_50 < uVar15) {
                        uVar19 = uVar13 + local_50;
                      }
                      lVar26 = *(long *)&pvVar6[local_78 + -1].
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data;
                      uVar20 = *(ushort *)(lVar26 + uVar23);
                      uVar1 = *(ushort *)(lVar26 + uVar19 * 2 + local_48 * uVar18 * 2);
                      if (local_c8[uVar18 * local_80 + (ulong)uVar1] <=
                          local_c8[uVar18 * local_80 + (ulong)uVar20]) {
                        uVar20 = uVar1;
                      }
                      *(ushort *)
                       ((long)pvVar7[-1].
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar10) = uVar20;
                      lVar10 = lVar10 + 2;
                      uVar23 = uVar23 + 2;
                    }
                    prVar17 = local_b0;
                    uVar13 = uVar22 + local_58;
                    lVar10 = lVar9 + local_60;
                    local_d0 = (ulong *)uVar22;
                    local_38 = lVar9;
                  }
                  local_78 = local_78 + 1;
                  uVar13 = uVar14 * 2;
                  local_68 = uVar14;
                  local_40 = uVar11;
                }
                return;
              }
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,
                         uVar12 - uVar13,&local_d1);
              std::
              vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                        (local_90,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8
                        );
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&local_a8);
              pvVar2 = (prVar17->superblock_mins).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar3 = (prVar17->superblock_mins).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              lVar9 = ((long)pvVar3 - (long)pvVar2) / 0x18;
              lVar26 = lVar10 + 1;
              uVar14 = 0;
              while( true ) {
                uVar18 = uVar13 + uVar14;
                uVar12 = prVar17->n_superblocks;
                if (uVar12 <= uVar18) break;
                uVar12 = uVar12 + ~((ulong)local_d0 >> 2);
                if (uVar18 <= uVar12) {
                  uVar12 = uVar18;
                }
                lVar4 = *(long *)&pvVar2[lVar10 + -1].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data;
                uVar11 = *(unsigned_long *)(lVar4 + uVar14 * 8);
                uVar21 = *(unsigned_long *)(lVar4 + uVar12 * 8);
                puVar5 = pvVar3[-1].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar18 = (long)pvVar3[-1].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3;
                if (puVar24[uVar11] < puVar24[uVar21]) {
                  if (uVar18 <= uVar14) {
                    __assert_fail("i < superblock_mins.back().size()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                                  ,0x82,
                                  "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                                 );
                  }
                  uVar21 = uVar11;
                  if (lVar9 != lVar26) {
                    __assert_fail("superblock_mins.size() == level+1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                                  ,0x83,
                                  "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                                 );
                  }
                }
                else {
                  if (uVar18 <= uVar14) {
                    __assert_fail("i < superblock_mins.back().size()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                                  ,0x86,
                                  "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                                 );
                  }
                  if (lVar9 != lVar26) {
                    __assert_fail("superblock_mins.size() == level+1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                                  ,0x87,
                                  "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                                 );
                  }
                  if ((ulong)((long)*(pointer *)
                                     ((long)&pvVar2[lVar10 + -1].
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3) <=
                      uVar12) {
                    __assert_fail("superblock_mins[level-1].size() > right_idx",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                                  ,0x88,
                                  "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                                 );
                  }
                }
                puVar5[uVar14] = uVar21;
                uVar14 = uVar14 + 1;
                prVar17 = local_b0;
              }
              local_d0 = (ulong *)((long)local_d0 * 2);
              lVar10 = lVar26;
            } while( true );
          }
          uVar12 = (long)end._M_current - (long)puVar16 >> 3;
          if (local_80 <= uVar12) {
            uVar12 = local_80;
          }
          local_d0 = puVar16 + uVar12;
          puVar24 = puVar16;
          _Var25._M_current = puVar16;
          while (puVar24 != local_d0) {
            uVar12 = (long)end._M_current - (long)puVar24 >> 3;
            if (block_size <= uVar12) {
              uVar12 = block_size;
            }
            _Var8 = std::
                    __min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                              (puVar24,puVar24 + uVar12);
            uVar13 = (long)_Var8._M_current - (long)puVar16 >> 3;
            if (local_80 <= uVar13) {
              __assertion = "block_min_idx < superblock_size";
              __line = 0x73;
              goto LAB_00124e41;
            }
            if (*_Var8._M_current < *_Var25._M_current) {
              _Var25 = _Var8;
            }
            *(short *)(**(long **)local_b8 +
                      ((ulong)((long)puVar24 - (long)local_c8 >> 3) / block_size) * 2) =
                 (short)uVar13;
            puVar24 = puVar24 + uVar12;
          }
          *(long *)(**(long **)local_90 +
                   ((ulong)((long)puVar16 - (long)local_c8 >> 3) / local_80) * 8) =
               (long)_Var25._M_current - (long)local_c8 >> 3;
          puVar16 = local_d0;
        } while( true );
      }
      __assertion = "superblock_size-1 <= std::numeric_limits<uint16_t>::max()";
      __line = 0x5c;
    }
    else {
      __assertion = "superblock_size % block_size == 0";
      __line = 0x55;
    }
  }
LAB_00124e41:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                ,__line,
                "rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
               );
}

Assistant:

rmq(Iterator begin, Iterator end,
        index_t superblock_size = DEFAULT_SUPERBLOCK_SIZE,
        index_t block_size = DEFAULT_BLOCK_SIZE)
        : _begin(begin), _end(end), superblock_size(superblock_size), block_size(block_size)
    {
        // get size
        assert((index_t)std::distance(begin, end) < std::numeric_limits<index_t>::max());
        n = std::distance(begin, end);


        // superblock size should be divisable by block size
        assert(superblock_size % block_size == 0);

        // get number of blocks
        n_superblocks = (n-1) / superblock_size + 1;
        n_blocks = (n-1) / block_size + 1;
        n_blocks_per_superblock = superblock_size / block_size;

        assert(superblock_size-1 <= std::numeric_limits<uint16_t>::max());


        // start by finding index of mins per block
        // for each superblock
        superblock_mins.push_back(std::vector<index_t>(n_superblocks));
        block_mins.push_back(std::vector<uint16_t>(n_blocks));
        Iterator it = begin;
        while (it != end) {
            // find index of minimum block in superblock
            Iterator min_pos = it;
            Iterator sb_end_it = it;
            std::advance(sb_end_it, std::min<std::size_t>(std::distance(it, end), superblock_size));
            for (Iterator block_it = it; block_it != sb_end_it; ) {
                Iterator block_end_it = block_it;
                std::advance(block_end_it, std::min<std::size_t>(std::distance(block_it, end), block_size));
                Iterator block_min_pos = std::min_element(block_it, block_end_it);
                // save minimum for superblock min
                if (*block_min_pos < *min_pos) {
                    min_pos = block_min_pos;
                }
                // save minimum for block min, relative to superblock start
                index_t block_min_idx = static_cast<index_t>(std::distance(it, block_min_pos));
                assert(block_min_idx < superblock_size);
                block_mins[0][std::distance(begin, block_it) / block_size] = static_cast<uint16_t>(block_min_idx);
                block_it = block_end_it;
            }
            superblock_mins[0][std::distance(begin, it) / superblock_size] = static_cast<index_t>(std::distance(begin, min_pos));
            it = sb_end_it;
        }

        // fill superblock lookup with dynamic programming
        index_t level = 1;
        for (index_t dist = 2; dist/2 < n_superblocks; dist <<= 1) {
            superblock_mins.push_back(std::vector<index_t>(n_superblocks - dist/2));
            for (index_t i = 0; i+dist/2 < n_superblocks; ++i) {
                index_t right_idx = std::min(i+dist/2, n_superblocks-dist/4-1);
                if (*(begin + superblock_mins[level-1][i]) < *(begin + superblock_mins[level-1][right_idx])) {
                    assert(i < superblock_mins.back().size());
                    assert(superblock_mins.size() == level+1);
                    superblock_mins.back()[i] = superblock_mins[level-1][i];
                } else {
                    assert(i < superblock_mins.back().size());
                    assert(superblock_mins.size() == level+1);
                    assert(superblock_mins[level-1].size() > right_idx);
                    superblock_mins.back()[i] = superblock_mins[level-1][right_idx];
                }
            }
            level++;
        }

        // now the same thing for blocks (but index relative to their
        // superblock)
        level = 1;
        index_t last_sb_nblocks = n_blocks - (n_superblocks-1)*n_blocks_per_superblock;
        for (index_t dist = 2; dist/2 < std::min(n_blocks,n_blocks_per_superblock); dist <<= 1) {
            if (n_blocks - n_superblocks*dist/2 == 0)
                break;
            index_t last_sb_cur_nblocks = 0;
            if (last_sb_nblocks > dist/2)
                last_sb_cur_nblocks = last_sb_nblocks - dist/2;
            block_mins.push_back(std::vector<uint16_t>((n_superblocks-1)*(n_blocks_per_superblock - dist/2) + last_sb_cur_nblocks));
            for (index_t sb = 0; sb < n_superblocks; ++sb) {
                index_t pre_sb_offset = sb*(n_blocks_per_superblock - dist/4);
                index_t sb_offset = sb*(n_blocks_per_superblock - dist/2);
                index_t blocks_in_sb = std::min(n_blocks - sb*n_blocks_per_superblock, n_blocks_per_superblock);
                for (index_t i = 0; i+dist/2 < blocks_in_sb; ++i) {
                    // TODO: right_idx might become negative for last superblock??
                    index_t right_idx = std::min(i + dist/2, blocks_in_sb-dist/4-1);
                    if (*(begin + block_mins[level-1][i        +pre_sb_offset] + sb*superblock_size)
                      < *(begin + block_mins[level-1][right_idx+pre_sb_offset] + sb*superblock_size))
                    {
                        block_mins.back()[i+sb_offset] = block_mins[level-1][i+pre_sb_offset];
                    } else {
                        block_mins.back()[i+sb_offset] = block_mins[level-1][right_idx+pre_sb_offset];
                    }
                }
            }
            level++;
        }

        //assert(check_superblock_correctness());
        //assert(check_block_correctness());
    }